

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

Bool AfterSpace(Lexer *lexer,Node *node)

{
  Node *node_00;
  Bool BVar1;
  Bool BVar2;
  
  BVar1 = prvTidynodeCMIsEmpty(node);
  while( true ) {
    BVar2 = prvTidynodeCMIsInline(node);
    if (BVar2 == no) {
      return yes;
    }
    node_00 = node->prev;
    if (node_00 != (Node *)0x0) break;
    if ((BVar1 != no) && (BVar2 = prvTidynodeCMIsInline(node->parent), BVar2 == no)) {
      return no;
    }
    node = node->parent;
  }
  BVar1 = prvTidynodeIsText(node_00);
  if (BVar1 != no) {
    BVar1 = prvTidyTextNodeEndWithSpace(lexer,node_00);
    return BVar1;
  }
  if ((node_00->tag != (Dict *)0x0) && (node_00->tag->id == TidyTag_BR)) {
    return yes;
  }
  return no;
}

Assistant:

static Bool AfterSpace(Lexer *lexer, Node *node)
{
    return AfterSpaceImp(lexer, node, TY_(nodeCMIsEmpty)(node));
}